

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O0

void __thiscall
diff_match_patch_test::assertEquals
          (diff_match_patch_test *this,wstring *strCase,wstring *s1,wstring *s2)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  wstring *this_00;
  undefined8 uVar4;
  wstring *s2_local;
  wstring *s1_local;
  wstring *strCase_local;
  diff_match_patch_test *this_local;
  
  bVar1 = std::operator!=(s1,s2);
  if (!bVar1) {
    ResetOutputStream();
    uVar4 = std::__cxx11::wstring::c_str();
    wprintf(L"%ls OK",uVar4);
    wprintf(L"\n");
    return;
  }
  ResetOutputStream();
  uVar4 = std::__cxx11::wstring::c_str();
  uVar2 = std::__cxx11::wstring::c_str();
  uVar3 = std::__cxx11::wstring::c_str();
  wprintf(L"%ls FAIL\nExpected: %ls\nActual: %ls",uVar4,uVar2,uVar3);
  wprintf(L"\n");
  this_00 = (wstring *)__cxa_allocate_exception(0x20);
  std::__cxx11::wstring::wstring(this_00,(wstring *)strCase);
  __cxa_throw(this_00,&std::__cxx11::wstring::typeinfo,std::__cxx11::wstring::~wstring);
}

Assistant:

void diff_match_patch_test::assertEquals(const std::wstring &strCase, const std::wstring &s1, const std::wstring &s2) {
  if (s1 != s2) {
    dmpDebug(L"%ls FAIL\nExpected: %ls\nActual: %ls",
           dmpPrintable(strCase), dmpPrintable(s1), dmpPrintable(s2));
    throw strCase;
  }
  dmpDebug(L"%ls OK", dmpPrintable(strCase));
}